

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O2

void __thiscall TCMallocTest_ManyThreads_Test::TestBody(TCMallocTest_ManyThreads_Test *this)

{
  pointer __last;
  pointer __last_00;
  size_type __n;
  pointer __result;
  thread *ptVar1;
  anon_class_8_1_ba1d7bde_for__M_head_impl *extraout_RDX;
  anon_class_8_1_ba1d7bde_for__M_head_impl *extraout_RDX_00;
  anon_class_8_1_ba1d7bde_for__M_head_impl *__args;
  anon_class_8_1_ba1d7bde_for__M_head_impl *extraout_RDX_01;
  anon_class_8_1_ba1d7bde_for__M_head_impl *__args_00;
  thread *t;
  long lVar2;
  undefined1 auVar3 [8];
  int iVar4;
  undefined1 auStack_88 [8];
  vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ptrs;
  _Head_base<0UL,_TesterThread_*,_false> local_50;
  undefined1 auStack_48 [8];
  vector<std::thread,_std::allocator<std::thread>_> threads;
  
  iVar4 = 0;
  printf("Testing threaded allocation/deallocation (%d threads)\n",10);
  auStack_88 = (undefined1  [8])0x0;
  ptrs.
  super__Vector_base<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ptrs.
  super__Vector_base<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ::reserve((vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
             *)auStack_88,10);
  while( true ) {
    local_50._M_head_impl._0_4_ = iVar4;
    if (9 < iVar4) break;
    std::
    make_unique<TesterThread,std::vector<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>,std::allocator<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>>>&,int&>
              ((vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
                *)auStack_48,(int *)auStack_88);
    std::
    vector<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>,std::allocator<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>>>
    ::emplace_back<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>>
              ((vector<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>,std::allocator<std::unique_ptr<TesterThread,std::default_delete<TesterThread>>>>
                *)auStack_88,
               (unique_ptr<TesterThread,_std::default_delete<TesterThread>_> *)auStack_48);
    if (auStack_48 != (undefined1  [8])0x0) {
      (*(code *)((((__uniq_ptr_impl<TesterThread,_std::default_delete<TesterThread>_> *)
                  &((id *)auStack_48)->_M_thread)->_M_t).
                 super__Tuple_impl<0UL,_TesterThread_*,_std::default_delete<TesterThread>_>.
                 super__Head_base<0UL,_TesterThread_*,_false>._M_head_impl)->all_threads_)();
    }
    iVar4 = (int)local_50._M_head_impl + 1;
  }
  auStack_48 = (undefined1  [8])0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            ((vector<std::thread,_std::allocator<std::thread>_> *)auStack_48,10);
  __args_00 = extraout_RDX;
  for (lVar2 = 0;
      __last = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start, auVar3 = auStack_48, lVar2 != 10; lVar2 = lVar2 + 1
      ) {
    local_50._M_head_impl =
         (((pointer)((long)auStack_88 + lVar2 * 8))->_M_t).
         super___uniq_ptr_impl<TesterThread,_std::default_delete<TesterThread>_>._M_t.
         super__Tuple_impl<0UL,_TesterThread_*,_std::default_delete<TesterThread>_>.
         super__Head_base<0UL,_TesterThread_*,_false>._M_head_impl;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start ==
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __n = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                      ((vector<std::thread,_std::allocator<std::thread>_> *)auStack_48,1,
                       "vector::_M_realloc_insert");
      __last_00 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start;
      auVar3 = auStack_48;
      __result = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                           ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)auStack_48,
                            __n);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,TCMallocTest_ManyThreads_Test::TestBody()::__0>
                ((allocator_type *)(((long)__last - (long)auVar3) + (long)__result),
                 (thread *)&local_50,__args);
      ptVar1 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         ((thread *)auVar3,__last,__result,(allocator<std::thread> *)auStack_48);
      ptVar1 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (__last,__last_00,ptVar1 + 1,(allocator<std::thread> *)auStack_48);
      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                ((_Vector_base<std::thread,_std::allocator<std::thread>_> *)auStack_48,
                 (pointer)auVar3,
                 (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)auVar3 >> 3);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = __result + __n;
      __args_00 = extraout_RDX_01;
      auStack_48 = (undefined1  [8])__result;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = ptVar1;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,TCMallocTest_ManyThreads_Test::TestBody()::__0>
                ((allocator_type *)
                 threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start,(thread *)&local_50,__args_00);
      __args_00 = extraout_RDX_00;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start =
           threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
  }
  for (; auVar3 != (undefined1  [8])__last; auVar3 = (undefined1  [8])((long)auVar3 + 8)) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)auStack_48);
  std::
  vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
  ::~vector((vector<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>,_std::allocator<std::unique_ptr<TesterThread,_std::default_delete<TesterThread>_>_>_>
             *)auStack_88);
  return;
}

Assistant:

TEST(TCMallocTest, ManyThreads) {
  printf("Testing threaded allocation/deallocation (%d threads)\n",
          FLAGS_numthreads);

  std::vector<std::unique_ptr<TesterThread>> ptrs;
  ptrs.reserve(FLAGS_numthreads);
  // Note, the logic inside PassObject requires us to create all
  // TesterThreads first, before starting any of them.
  for (int i = 0; i < FLAGS_numthreads; i++) {
    ptrs.emplace_back(std::make_unique<TesterThread>(ptrs, i));
  }

  std::vector<std::thread> threads;
  threads.reserve(FLAGS_numthreads);
  for (int i = 0; i < FLAGS_numthreads; i++) {
    threads.emplace_back([thr = ptrs[i].get()] () {
      thr->Run();
    });
  }
  for (auto& t : threads) {
    t.join();
  }
}